

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fft4g.c
# Opt level: O0

void makect(int nc,int *ip,double *c)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double delta;
  int nch;
  int j;
  double *c_local;
  int *ip_local;
  int nc_local;
  
  ip[1] = nc;
  if (1 < nc) {
    iVar1 = nc >> 1;
    dVar2 = atan(1.0);
    dVar2 = dVar2 / (double)iVar1;
    dVar3 = cos(dVar2 * (double)iVar1);
    *c = dVar3;
    c[iVar1] = *c * 0.5;
    for (delta._4_4_ = 1; delta._4_4_ < iVar1; delta._4_4_ = delta._4_4_ + 1) {
      dVar3 = cos(dVar2 * (double)delta._4_4_);
      c[delta._4_4_] = dVar3 * 0.5;
      dVar3 = sin(dVar2 * (double)delta._4_4_);
      c[nc - delta._4_4_] = dVar3 * 0.5;
    }
  }
  return;
}

Assistant:

void makect(int nc, int *ip, double *c)
{
    int j, nch;
    double delta;
    
    ip[1] = nc;
    if (nc > 1) {
        nch = nc >> 1;
        delta = atan(1.0) / nch;
        c[0] = cos(delta * nch);
        c[nch] = 0.5 * c[0];
        for (j = 1; j < nch; j++) {
            c[j] = 0.5 * cos(delta * j);
            c[nc - j] = 0.5 * sin(delta * j);
        }
    }
}